

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

long __thiscall
cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>::fill
          (cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>
           *this,void *input_buffer,long *input_frames_count,void *output_buffer,
          long output_frames_needed)

{
  long lVar1;
  undefined8 in_RCX;
  long *plVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  short *out_buffer;
  short *in_buffer;
  code *local_50;
  
  local_50 = *(code **)(in_RDI + 0x18);
  plVar2 = (long *)(in_RDI + *(long *)(in_RDI + 0x20));
  if (((ulong)local_50 & 1) != 0) {
    local_50 = *(code **)(local_50 + *plVar2 + -1);
  }
  lVar1 = (*local_50)(plVar2,in_RSI,in_RDX,in_RCX,in_R8);
  return lVar1;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill(
    void * input_buffer, long * input_frames_count, void * output_buffer,
    long output_frames_needed)
{
  /* Input and output buffers, typed */
  T * in_buffer = reinterpret_cast<T *>(input_buffer);
  T * out_buffer = reinterpret_cast<T *>(output_buffer);
  return (this->*fill_internal)(in_buffer, input_frames_count, out_buffer,
                                output_frames_needed);
}